

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall
Fossilize::StateRecorder::Impl::register_on_use(Impl *this,ResourceTag tag,Hash hash)

{
  int iVar1;
  uint64_t t;
  
  if ((((this->record_data).write_database_entries == true) &&
      (this->on_use_database_iface != (DatabaseInterface *)0x0)) &&
     (iVar1 = (*this->on_use_database_iface->_vptr_DatabaseInterface[5])(), (char)iVar1 == '\0')) {
    t = time((time_t *)0x0);
    (*this->on_use_database_iface->_vptr_DatabaseInterface[4])
              (this->on_use_database_iface,tag,hash,&t,8,8);
  }
  return;
}

Assistant:

void StateRecorder::Impl::register_on_use(ResourceTag tag, Hash hash) const
{
	if (record_data.write_database_entries && on_use_database_iface &&
	    !on_use_database_iface->has_entry(tag, hash))
	{
		uint64_t t = time(nullptr);
		on_use_database_iface->write_entry(tag, hash, &t, sizeof(t), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);
	}
}